

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cali.cpp
# Opt level: O3

void cali_begin_int_byname(char *attr_name,int val)

{
  Attribute attr;
  Caliper c;
  allocator<char> local_69;
  Attribute local_68;
  string local_60;
  Caliper local_40;
  
  cali::Caliper::Caliper(&local_40);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,attr_name,&local_69);
  local_68 = cali::Caliper::create_attribute
                       (&local_40,&local_60,CALI_TYPE_INT,0,0,(Attribute *)0x0,(Variant *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  local_60._M_string_length = (size_type)val;
  local_60._M_dataplus._M_p = (pointer)0x2;
  cali::Caliper::begin(&local_40,&local_68,(Variant *)&local_60);
  return;
}

Assistant:

void cali_begin_int_byname(const char* attr_name, int val)
{
    Caliper   c;
    Attribute attr = c.create_attribute(attr_name, CALI_TYPE_INT, CALI_ATTR_DEFAULT);

    c.begin(attr, Variant(val));
}